

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O0

void __thiscall hrgls::Message::Message(Message *this)

{
  hrgls_Status hVar1;
  Message_private *this_00;
  hrgls_Message local_18;
  hrgls_Message obj;
  Message *this_local;
  
  this->m_private = (Message_private *)0x0;
  obj = (hrgls_Message)this;
  this_00 = (Message_private *)operator_new(0x10);
  Message_private::Message_private(this_00);
  this->m_private = this_00;
  local_18 = (hrgls_Message)0x0;
  hVar1 = hrgls_MessageCreate(&local_18);
  this->m_private->status = hVar1;
  this->m_private->Message = local_18;
  return;
}

Assistant:

Message::Message()
  {
    m_private = new Message_private;
    hrgls_Message obj = nullptr;
    m_private->status = hrgls_MessageCreate(&obj);
    m_private->Message = obj;
  }